

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  Lexer *this_00;
  pointer *pppEVar1;
  BindingEnv *pBVar2;
  Node **ppNVar3;
  pointer ppNVar4;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  size_type sVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Rule *pRVar10;
  Edge *pEVar11;
  Pool *pPVar12;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var13;
  pointer ppNVar14;
  Node *pNVar15;
  long *plVar16;
  _Rb_tree_header *p_Var17;
  pointer ppVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  int iVar21;
  ManifestParser *pMVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  ulong uVar25;
  pointer pEVar26;
  int iVar27;
  byte bVar28;
  string dyndep;
  string pool_name;
  EvalString val;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  vector<EvalString,_std::allocator<EvalString>_> validations;
  uint64_t slash_bits;
  uint64_t slash_bits_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ManifestParser *local_148;
  byte local_139;
  undefined1 local_138 [40];
  Edge *local_110;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int local_c8;
  int local_c4;
  BindingEnv *local_c0;
  vector<EvalString,_std::allocator<EvalString>_> local_b8;
  vector<EvalString,_std::allocator<EvalString>_> local_98;
  Rule *local_80;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint64_t local_38;
  
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_d8._M_allocated_capacity = 0;
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
  if (!bVar7) {
LAB_0011f2f5:
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&local_e8);
LAB_0011f302:
    bVar7 = false;
LAB_0011f304:
    std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
    std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_b8);
    std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_98);
    return bVar7;
  }
  local_148 = this;
LAB_0011f25e:
  pMVar22 = local_148;
  if (local_e8._M_allocated_capacity != local_e8._8_8_) goto LAB_0011f274;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_e8);
  bVar7 = Lexer::PeekToken(this_00,PIPE);
  iVar27 = 0;
  if (bVar7) {
    iVar27 = 0;
    do {
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_d8._M_allocated_capacity = 0;
      bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
      iVar21 = 1;
      if (bVar7) {
        if (local_e8._M_allocated_capacity == local_e8._8_8_) {
          iVar21 = 4;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    (&local_b8,(value_type *)&local_e8);
          iVar27 = iVar27 + 1;
          iVar21 = 0;
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)&local_e8);
    } while (iVar21 == 0);
    pMVar22 = local_148;
    if (iVar21 != 4) goto LAB_0011f302;
  }
  if (local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected path","");
    bVar7 = Lexer::Error(this_00,(string *)&local_e8,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity == &local_d8) goto LAB_0011f304;
    goto LAB_0011f8bc;
  }
  bVar7 = Parser::ExpectToken(&pMVar22->super_Parser,COLON,err);
  if (!bVar7) goto LAB_0011f302;
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  local_e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
  bVar7 = Lexer::ReadIdent(this_00,(string *)&local_e8);
  if (bVar7) {
    pRVar10 = BindingEnv::LookupRule(pMVar22->env_,(string *)&local_e8);
    if (pRVar10 == (Rule *)0x0) {
      std::operator+(&local_168,"unknown build rule \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8)
      ;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_168);
      pNVar15 = (Node *)(plVar16 + 2);
      if ((Node *)*plVar16 == pNVar15) {
        local_138._16_8_ = (pNVar15->path_)._M_dataplus._M_p;
        local_138._24_8_ = plVar16[3];
        local_138._0_8_ = (Node *)(local_138 + 0x10);
      }
      else {
        local_138._16_8_ = (pNVar15->path_)._M_dataplus._M_p;
        local_138._0_8_ = (Node *)*plVar16;
      }
      local_138._8_8_ = plVar16[1];
      *plVar16 = (long)pNVar15;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      bVar7 = Lexer::Error(this_00,(string *)local_138,err);
      if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
      }
      uVar23 = local_168.field_2._M_allocated_capacity;
      _Var24._M_p = local_168._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_0011f8a3;
    }
    else {
      local_80 = pRVar10;
      do {
        local_138._0_8_ = (Node *)0x0;
        local_138._8_8_ = (Node *)0x0;
        local_138._16_8_ = (pointer)0x0;
        bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,err);
        iVar21 = 1;
        if (bVar7) {
          if (local_138._0_8_ == local_138._8_8_) {
            iVar21 = 6;
          }
          else {
            iVar21 = 0;
            std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                      (&local_98,(EvalString *)local_138);
          }
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)local_138);
      } while (iVar21 == 0);
      if (iVar21 == 6) {
        bVar7 = Lexer::PeekToken(this_00,PIPE);
        local_c4 = 0;
        if (bVar7) {
          local_c4 = 0;
          do {
            local_138._0_8_ = (Node *)0x0;
            local_138._8_8_ = (Node *)0x0;
            local_138._16_8_ = (pointer)0x0;
            bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,err);
            iVar21 = 1;
            if (bVar7) {
              if (local_138._0_8_ == local_138._8_8_) {
                iVar21 = 8;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          (&local_98,(EvalString *)local_138);
                local_c4 = local_c4 + 1;
                iVar21 = 0;
              }
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          } while (iVar21 == 0);
          if (iVar21 != 8) goto LAB_0011f7ed;
        }
        pMVar22 = local_148;
        bVar7 = Lexer::PeekToken(this_00,PIPE2);
        local_c8 = 0;
        if (bVar7) {
          local_c8 = 0;
          do {
            local_138._0_8_ = (Node *)0x0;
            local_138._8_8_ = (Node *)0x0;
            local_138._16_8_ = (pointer)0x0;
            bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,err);
            iVar21 = 1;
            if (bVar7) {
              if (local_138._0_8_ == local_138._8_8_) {
                iVar21 = 10;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          (&local_98,(EvalString *)local_138);
                local_c8 = local_c8 + 1;
                iVar21 = 0;
              }
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          } while (iVar21 == 0);
          pMVar22 = local_148;
          if (iVar21 != 10) goto LAB_0011f7ed;
        }
        bVar7 = Lexer::PeekToken(this_00,PIPEAT);
        if (bVar7) {
          do {
            local_138._0_8_ = (Node *)0x0;
            local_138._8_8_ = (Node *)0x0;
            local_138._16_8_ = (pointer)0x0;
            bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,err);
            iVar21 = 1;
            if (bVar7) {
              if (local_138._0_8_ == local_138._8_8_) {
                iVar21 = 0xc;
              }
              else {
                iVar21 = 0;
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          (&local_78,(EvalString *)local_138);
              }
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          } while (iVar21 == 0);
          pMVar22 = local_148;
          if (iVar21 != 0xc) goto LAB_0011f7ed;
        }
        bVar7 = Parser::ExpectToken(&pMVar22->super_Parser,NEWLINE,err);
        if (bVar7) {
          bVar8 = Lexer::PeekToken(this_00,INDENT);
          if (bVar8) {
            local_c0 = (BindingEnv *)operator_new(0x70);
            pBVar2 = pMVar22->env_;
            (local_c0->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_0013ea50;
            p_Var17 = &(local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header;
            (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var17->_M_header;
            (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var17->_M_header;
            (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var17 = &(local_c0->rules_)._M_t._M_impl.super__Rb_tree_header;
            (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var17->_M_header;
            (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var17->_M_header;
            (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c0->parent_ = pBVar2;
          }
          else {
            local_c0 = pMVar22->env_;
          }
          do {
            pMVar22 = local_148;
            if (bVar8 == false) {
              pEVar11 = State::AddEdge((local_148->super_Parser).state_,local_80);
              pEVar11->env_ = local_c0;
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pool","");
              Edge::GetBinding((string *)local_138,pEVar11,&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                (ulong)(local_168.field_2._M_allocated_capacity + 1));
              }
              local_110 = pEVar11;
              if ((Node *)local_138._8_8_ != (Node *)0x0) {
                pPVar12 = State::LookupPool((pMVar22->super_Parser).state_,(string *)local_138);
                if (pPVar12 == (Pool *)0x0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_108,"unknown pool name \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_138);
                  plVar16 = (long *)std::__cxx11::string::append(local_108);
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  pNVar15 = (Node *)(plVar16 + 2);
                  if ((Node *)*plVar16 == pNVar15) {
                    local_168.field_2._M_allocated_capacity =
                         (size_type)(pNVar15->path_)._M_dataplus._M_p;
                    local_168.field_2._8_8_ = plVar16[3];
                  }
                  else {
                    local_168.field_2._M_allocated_capacity =
                         (size_type)(pNVar15->path_)._M_dataplus._M_p;
                    local_168._M_dataplus._M_p = (pointer)*plVar16;
                  }
                  local_168._M_string_length = plVar16[1];
                  *plVar16 = (long)pNVar15;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  bVar7 = Lexer::Error(this_00,&local_168,err);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    (ulong)(local_168.field_2._M_allocated_capacity + 1));
                  }
                  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                  }
                }
                else {
                  pEVar11->pool_ = pPVar12;
                  bVar7 = false;
                }
                if (pPVar12 != (Pool *)0x0) goto LAB_0011fb24;
                goto LAB_0012019a;
              }
              bVar7 = false;
LAB_0011fb24:
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                        (&local_110->outputs_,
                         ((long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
              bVar28 = (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                             _M_impl.super__Vector_impl_data._M_start == 0;
              if ((bool)bVar28) goto LAB_0011fd0e;
              uVar25 = ((long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              pRVar10 = (Rule *)0x0;
              goto LAB_0011fb85;
            }
            local_138._0_8_ = local_138 + 0x10;
            local_138._8_8_ = (Node *)0x0;
            local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
            local_108._16_8_ = (pointer)0x0;
            local_108._0_8_ = (pointer)0x0;
            local_108._8_8_ = (pointer)0x0;
            bVar9 = ParseLet(local_148,(string *)local_138,(EvalString *)local_108,err);
            if (bVar9) {
              EvalString::Evaluate_abi_cxx11_
                        (&local_168,(EvalString *)local_108,&pMVar22->env_->super_Env);
              BindingEnv::AddBinding(local_c0,(string *)local_138,&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                (ulong)(local_168.field_2._M_allocated_capacity + 1));
              }
              bVar8 = Lexer::PeekToken(this_00,INDENT);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_108);
            if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
            }
            bVar7 = false;
          } while (bVar9);
        }
        else {
          bVar7 = false;
        }
      }
      else {
LAB_0011f7ed:
        bVar7 = false;
      }
    }
  }
  else {
    local_138._0_8_ = (Node *)(local_138 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"expected build command name","");
    bVar7 = Lexer::Error(this_00,(string *)local_138,err);
    uVar23 = local_138._16_8_;
    _Var24._M_p = (pointer)local_138._0_8_;
    if ((Node *)local_138._0_8_ == (Node *)(local_138 + 0x10)) goto LAB_0011f8ab;
LAB_0011f8a3:
    operator_delete(_Var24._M_p,(ulong)((long)&(((pointer)uVar23)->first)._M_dataplus._M_p + 1));
  }
  goto LAB_0011f8ab;
LAB_0011f274:
  std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&local_b8,(value_type *)&local_e8)
  ;
  uVar6 = local_e8._8_8_;
  uVar23 = local_e8._M_allocated_capacity;
  if (local_e8._8_8_ != local_e8._M_allocated_capacity) {
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_e8._M_allocated_capacity + 0x10);
    do {
      plVar16 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar16) {
        operator_delete(plVar16,paVar19->_M_allocated_capacity + 1);
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar19 + 0x18);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar19 + 0x28);
    } while (paVar20 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar6);
    local_e8._8_8_ = uVar23;
  }
  bVar7 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
  if (!bVar7) goto LAB_0011f2f5;
  goto LAB_0011f25e;
  while( true ) {
    pRVar10 = (Rule *)((long)&(pRVar10->name_).field_2 + 8);
    uVar25 = uVar25 - 1;
    bVar28 = uVar25 == 0;
    if ((bool)bVar28) break;
LAB_0011fb85:
    local_139 = bVar28;
    EvalString::Evaluate_abi_cxx11_
              (&local_168,
               (EvalString *)
               ((long)&(pRVar10->name_)._M_dataplus._M_p +
               (long)&((local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_start)->parsed_).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl),&local_c0->super_Env);
    if (local_168._M_string_length == 0) {
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"empty path","");
      bVar7 = Lexer::Error(this_00,(string *)local_108,err);
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      bVar8 = false;
    }
    else {
      CanonicalizePath(&local_168,(uint64_t *)&local_58);
      path.len_ = local_168._M_string_length;
      path.str_ = local_168._M_dataplus._M_p;
      bVar9 = State::AddOut((local_148->super_Parser).state_,local_110,path,
                            (uint64_t)local_58._M_dataplus._M_p);
      bVar8 = true;
      if (!bVar9) {
        if ((local_148->options_).dupe_edge_action_ == kDupeEdgeActionError) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,"multiple rules generate ",&local_168);
          Lexer::Error(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_108,err);
          if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          }
          bVar8 = false;
          bVar7 = false;
        }
        else {
          if (local_148->quiet_ == false) {
            Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway"
                    ,local_168._M_dataplus._M_p);
          }
          bVar8 = true;
          iVar27 = iVar27 + -1 + (uint)((ulong)(long)iVar27 < uVar25);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      local_80 = pRVar10;
      operator_delete(local_168._M_dataplus._M_p,
                      (ulong)(local_168.field_2._M_allocated_capacity + 1));
      pRVar10 = local_80;
    }
    bVar28 = local_139;
    if (!bVar8) break;
  }
LAB_0011fd0e:
  pEVar11 = local_110;
  if ((bVar28 & 1) != 0) {
    if ((local_110->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_110->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pppEVar1 = &(((local_148->super_Parser).state_)->edges_).
                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + -1;
      Edge::~Edge(local_110);
      operator_delete(pEVar11,0x88);
      bVar7 = true;
    }
    else {
      local_110->implicit_outs_ = iVar27;
      std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                (&local_110->inputs_,
                 ((long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      for (pEVar26 = local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                     super__Vector_impl_data._M_start;
          bVar8 = pEVar26 !=
                  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar8; pEVar26 = pEVar26 + 1) {
        EvalString::Evaluate_abi_cxx11_(&local_168,pEVar26,&local_c0->super_Env);
        sVar5 = local_168._M_string_length;
        if (local_168._M_string_length == 0) {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"empty path","");
          bVar7 = Lexer::Error(this_00,(string *)local_108,err);
          if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          }
        }
        else {
          CanonicalizePath(&local_168,(uint64_t *)local_108);
          path_00.len_ = local_168._M_string_length;
          path_00.str_ = local_168._M_dataplus._M_p;
          State::AddIn((local_148->super_Parser).state_,local_110,path_00,local_108._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        if (sVar5 == 0) break;
      }
      if (!bVar8) {
        local_110->implicit_deps_ = local_c4;
        local_110->order_only_deps_ = local_c8;
        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                  (&local_110->validations_,
                   ((long)local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        for (pEVar26 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                       super__Vector_impl_data._M_start;
            bVar8 = pEVar26 !=
                    local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_finish, bVar8; pEVar26 = pEVar26 + 1) {
          EvalString::Evaluate_abi_cxx11_(&local_168,pEVar26,&local_c0->super_Env);
          sVar5 = local_168._M_string_length;
          if (local_168._M_string_length == 0) {
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"empty path","");
            bVar7 = Lexer::Error(this_00,(string *)local_108,err);
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
          }
          else {
            CanonicalizePath(&local_168,(uint64_t *)local_108);
            path_01.len_ = local_168._M_string_length;
            path_01.str_ = local_168._M_dataplus._M_p;
            State::AddValidation((local_148->super_Parser).state_,local_110,path_01,local_108._0_8_)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if (sVar5 == 0) break;
        }
        if (!bVar8) {
          if (((local_148->options_).phony_cycle_action_ == kPhonyCycleActionWarn) &&
             (bVar8 = Edge::maybe_phonycycle_diagnostic(local_110), bVar8)) {
            local_168._M_dataplus._M_p =
                 (pointer)*(local_110->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            _Var13 = std::
                     __remove_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                               ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                 )(local_110->inputs_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                 )(local_110->inputs_).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish,
                                (_Iter_equals_val<Node_*const>)&local_168);
            ppNVar3 = (local_110->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (_Var13._M_current != ppNVar3) {
              ppNVar4 = (local_110->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              ppNVar14 = (pointer)((long)_Var13._M_current + ((long)ppNVar4 - (long)ppNVar3));
              if (ppNVar4 != ppNVar14) {
                (local_110->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish = ppNVar14;
              }
              if (local_148->quiet_ == false) {
                Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]"
                        ,*(size_type *)local_168._M_dataplus._M_p);
              }
            }
          }
          Edge::GetUnescapedDyndep_abi_cxx11_(&local_168,local_110);
          if (local_168._M_string_length == 0) {
LAB_00120174:
            bVar7 = true;
          }
          else {
            CanonicalizePath(&local_168,&local_38);
            path_02.len_ = local_168._M_string_length;
            path_02.str_ = local_168._M_dataplus._M_p;
            pNVar15 = State::GetNode((local_148->super_Parser).state_,path_02,local_38);
            local_110->dyndep_ = pNVar15;
            pNVar15->dyndep_pending_ = true;
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                               ((local_110->inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (local_110->inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_finish,&local_110->dyndep_);
            ppNVar4 = (local_110->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (_Var13._M_current == ppNVar4) {
              std::operator+(&local_58,"dyndep \'",&local_168);
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_58);
              ppVar18 = (pointer)(plVar16 + 2);
              if ((pointer)*plVar16 == ppVar18) {
                local_108._16_8_ = (ppVar18->first)._M_dataplus._M_p;
                local_108._24_8_ = plVar16[3];
                local_108._0_8_ = (pointer)(local_108 + 0x10);
              }
              else {
                local_108._16_8_ = (ppVar18->first)._M_dataplus._M_p;
                local_108._0_8_ = (pointer)*plVar16;
              }
              local_108._8_8_ = plVar16[1];
              *plVar16 = (long)ppVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              bVar7 = Lexer::Error(this_00,(string *)local_108,err);
              if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if (_Var13._M_current != ppNVar4) goto LAB_00120174;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
        }
      }
    }
  }
LAB_0012019a:
  uVar23 = local_138._16_8_;
  _Var24._M_p = (pointer)local_138._0_8_;
  if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) goto LAB_0011f8a3;
LAB_0011f8ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_allocated_capacity == &local_d8) goto LAB_0011f304;
LAB_0011f8bc:
  operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
  goto LAB_0011f304;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs, validations;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  // Add all validations, counting how many as we go.
  if (lexer_.PeekToken(Lexer::PIPEAT)) {
    for (;;) {
      EvalString validation;
      if (!lexer_.ReadPath(&validation, err))
        return false;
      if (validation.empty())
        break;
      validations.push_back(validation);
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path, err);
        return false;
      } else {
        if (!quiet_) {
          Warning(
              "multiple rules generate %s. builds involving this target will "
              "not be correct; continuing anyway",
              path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }

  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  edge->validations_.reserve(validations.size());
  for (std::vector<EvalString>::iterator v = validations.begin();
      v != validations.end(); ++v) {
    string path = v->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddValidation(edge, path, slash_bits);
  }

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    CanonicalizePath(&dyndep, &slash_bits);
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}